

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

t_int * tabreceive_perform(t_int *w)

{
  long lVar1;
  long local_38;
  t_int vecsize;
  t_word *from;
  undefined4 *puStack_20;
  int n;
  t_sample *out;
  t_tabreceive *x;
  t_int *w_local;
  
  lVar1 = w[1];
  puStack_20 = (undefined4 *)w[2];
  from._4_4_ = (int)w[3];
  vecsize = *(long *)(lVar1 + 0x30);
  if (vecsize == 0) {
    while (from._4_4_ != 0) {
      *puStack_20 = 0;
      from._4_4_ = from._4_4_ + -1;
      puStack_20 = puStack_20 + 1;
    }
  }
  else {
    local_38 = (long)*(int *)(lVar1 + 0x40);
    if (from._4_4_ < local_38) {
      local_38 = (long)from._4_4_;
    }
    while (local_38 != 0) {
      *puStack_20 = *(undefined4 *)vecsize;
      local_38 = local_38 + -1;
      vecsize = vecsize + 8;
      puStack_20 = puStack_20 + 1;
    }
    local_38 = (long)(from._4_4_ - *(int *)(lVar1 + 0x40));
    if (0 < local_38) {
      while (local_38 != 0) {
        *puStack_20 = 0;
        local_38 = local_38 + -1;
        puStack_20 = puStack_20 + 1;
      }
    }
  }
  return w + 4;
}

Assistant:

static t_int *tabreceive_perform(t_int *w)
{
    t_tabreceive *x = (t_tabreceive *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    t_word *from = x->x_vec;
    if (from)
    {
        t_int vecsize = x->x_npoints;
        if (vecsize > n)
            vecsize = n;
        while (vecsize--)
            *out++ = (from++)->w_float;
        vecsize = n - x->x_npoints;
        if (vecsize > 0)
            while (vecsize--)
                *out++ = 0;
    }
    else while (n--) *out++ = 0;
    return (w+4);
}